

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# osnoui.c
# Opt level: O0

int os_get_rel_path(char *result,size_t result_len,char *basepath,char *filename)

{
  char *pcVar1;
  char *in_RCX;
  char *in_RDX;
  long in_RSI;
  char *in_RDI;
  bool bVar2;
  char *rp;
  size_t rem;
  char *bsep;
  char *fsep;
  char *bp;
  char *fp;
  char *local_58;
  size_t local_50;
  char *local_48;
  char *local_40;
  char *local_38;
  char *local_30;
  int local_4;
  
  local_40 = (char *)0x0;
  local_48 = (char *)0x0;
  local_38 = in_RDX;
  local_30 = in_RCX;
  do {
    bVar2 = true;
    if (*local_30 != *local_38) {
      if (*local_30 == '/') {
LAB_0010ed2f:
        bVar2 = true;
        if ((*local_38 != '/') && (bVar2 = false, *local_38 != '\0')) {
          pcVar1 = strchr("",(int)*local_38);
          bVar2 = pcVar1 != (char *)0x0;
        }
      }
      else {
        bVar2 = false;
        if (*local_30 != '\0') {
          pcVar1 = strchr("",(int)*local_30);
          bVar2 = false;
          if (pcVar1 != (char *)0x0) goto LAB_0010ed2f;
        }
      }
    }
    if (!bVar2) break;
    if ((*local_30 == '/') ||
       (((*local_30 != '\0' && (pcVar1 = strchr("",(int)*local_30), pcVar1 != (char *)0x0)) ||
        (*local_30 == '\0')))) {
      local_40 = local_30;
      local_48 = local_38;
    }
    if ((*local_30 == '\0') || (*local_38 == '\0')) break;
    local_30 = local_30 + 1;
    local_38 = local_38 + 1;
  } while( true );
  if ((local_48 == (char *)0x0) || (local_40 == (char *)0x0)) {
    strncpy(in_RDI,in_RCX,in_RSI - 1);
    in_RDI[in_RSI + -1] = '\0';
    local_4 = 0;
  }
  else {
    if ((*local_38 == '\0') &&
       (((*local_30 == '/' ||
         ((*local_30 != '\0' && (pcVar1 = strchr("",(int)*local_30), pcVar1 != (char *)0x0)))) ||
        (*local_30 == '\0')))) {
      local_40 = local_30;
      local_48 = local_38;
    }
    if (*local_48 != '\0') {
      local_48 = local_48 + 1;
    }
    if (*local_40 != '\0') {
      local_40 = local_40 + 1;
    }
    local_50 = in_RSI - 1;
    local_58 = in_RDI;
    while (*local_48 != '\0') {
      if (local_50 < 4) {
        local_50 = 0;
        break;
      }
      *local_58 = '.';
      pcVar1 = local_58 + 2;
      local_58[1] = '.';
      local_58 = local_58 + 3;
      *pcVar1 = '/';
      local_50 = local_50 - 3;
      while( true ) {
        bVar2 = false;
        if (*local_48 != '\0') {
          bVar2 = true;
          if ((*local_48 != '/') && (bVar2 = false, *local_48 != '\0')) {
            pcVar1 = strchr("",(int)*local_48);
            bVar2 = pcVar1 != (char *)0x0;
          }
          bVar2 = (bool)(bVar2 ^ 1);
        }
        if (!bVar2) break;
        local_48 = local_48 + 1;
      }
      if (*local_48 != '\0') {
        local_48 = local_48 + 1;
      }
    }
    strncpy(local_58,local_40,local_50);
    local_58[local_50] = '\0';
    if (*in_RDI == '\0') {
      strcpy(local_58,".");
    }
    local_4 = 1;
  }
  return local_4;
}

Assistant:

int os_get_rel_path(char *result, size_t result_len,
                    const char *basepath, const char *filename)
{
    const char *fp;
    const char *bp;
    const char *fsep;
    const char *bsep;
    size_t rem;
    char *rp;

#if defined(MSDOS)
    /*
     *   DOS and some other systems (e.g., VMS) use drive letter, volume, or
     *   device prefixes, and each drive/volume/device is effectively its own
     *   separate namespace with its own root directory.  There's typically
     *   no syntax on these systems to refer to a container entity above the
     *   volume level, or the parent of a volume root, which means there's no
     *   way to write a filename in relative terms when it's on a different
     *   volume from the base path.
     *   
     *   So: start by checking for a drive/volume prefix.  If both paths have
     *   one (and they both should if the system uses them at all, as both
     *   paths are supposed to be handed to us in absolute format), make sure
     *   they match; if not, we can't form a relative name.
     */
    bp = oss_parse_volume(basepath);
    fp = oss_parse_volume(filename);
    if (bp != 0 && fp != 0
        && (bp - basepath != fp - filename
            || pathmemcmp(basepath, filename, bp - basepath) != 0))
    {
        /* we have volumes, and they don't match - we can't relativize it */
        strncpy(result, filename, result_len - 1);
        result[result_len - 1] = '\0';
        return FALSE;
    }
#endif

    /*
     *   Find the common path prefix.  We can lop off any leading elements
     *   that the two paths have in common.
     */
    for (fp = filename, bp = basepath, fsep = 0, bsep = 0 ;
         pathchareq(*fp, *bp) || (ispathchar(*fp) && ispathchar(*bp)) ;
         ++fp, ++bp)
    {
        /* 
         *   if this is a separator character, note it - we want to keep
         *   track of the last separator in the common portion, since this is
         *   the end of the common path prefix 
         */
        if (ispathchar(*fp) || *fp == '\0')
        {
            fsep = fp;
            bsep = bp;
        }

        /* stop at the end of the strings */
        if (*fp == '\0' || *bp == '\0')
            break;
    }

    /* if we didn't find any separators, we can't relativize the paths */
    if (bsep == 0 || fsep == 0)
    {
        /* nothing in common - return the filename unchanged */
        strncpy(result, filename, result_len - 1);
        result[result_len - 1] = '\0';
        return FALSE;
    }

    /*
     *   If we reached the end of the base path string, and we're at a path
     *   separator in the filename string, then the entire base path prefix
     *   is in common to both names.
     */
    if (*bp == '\0' && (ispathchar(*fp) || *fp == '\0'))
    {
        fsep = fp;
        bsep = bp;
    }

    /* if we're at a path separator in the base path, skip it */
    if (*bsep != '\0')
        ++bsep;

    /* if we're at a path separator in the filename, skip it */
    if (*fsep != '\0')
        ++fsep;

    /*
     *   Everything up to fsep and bsep can be dropped, because it's a common
     *   directory path prefix.  We must now add the relative adjustment
     *   portion: add a ".." directory for each remaining directory in the
     *   base path, since we must move from the base path up to the common
     *   ancestor; then add the rest of the filename path.
     */

    /* 
     *   first, set up to copy into the result buffer - leave space for null
     *   termination
     */
    rp = result;
    rem = result_len - 1;

    /* add a ".." for each remaining directory in the base path string */
    while (*bsep != '\0')
    {
        /* add ".." and a path separator */
        if (rem > 3)
        {
            *rp++ = '.';
            *rp++ = '.';
            *rp++ = OSPATHCHAR;
            rem -= 3;
        }
        else
        {
            /* no more room - give up */
            rem = 0;
            break;
        }

        /* scan to the next path separator */
        for ( ; *bsep != '\0' && !ispathchar(*bsep) ; ++bsep) ;

        /* if this is a path separator, skip it */
        if (*bsep != '\0')
            ++bsep;
    }

    /*
     *   Copy the remainder of the filename, or as much as will fit, and
     *   ensure that the result is properly null-terminated 
     */
    strncpy(rp, fsep, rem);
    rp[rem] = '\0';

    /* if the result is empty, return "." to represent the current dir */
    if (result[0] == '\0')
        strcpy(rp, ".");

    /* success */
    return TRUE;
}